

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

void __thiscall
json11::anon_unknown_22::JsonParser::encode_utf8(JsonParser *this,long pt,string *out)

{
  char cVar1;
  
  if ((long)this < 0) {
    return;
  }
  cVar1 = (char)pt;
  if (0x7f < (long)this) {
    if (0x7ff < (long)this) {
      if (0xffff < (long)this) {
        std::__cxx11::string::push_back(cVar1);
      }
      std::__cxx11::string::push_back(cVar1);
    }
    std::__cxx11::string::push_back(cVar1);
  }
  std::__cxx11::string::push_back(cVar1);
  return;
}

Assistant:

void encode_utf8(long pt, string & out) {
        if (pt < 0)
            return;

        if (pt < 0x80) {
            out += static_cast<char>(pt);
        } else if (pt < 0x800) {
            out += static_cast<char>((pt >> 6) | 0xC0);
            out += static_cast<char>((pt & 0x3F) | 0x80);
        } else if (pt < 0x10000) {
            out += static_cast<char>((pt >> 12) | 0xE0);
            out += static_cast<char>(((pt >> 6) & 0x3F) | 0x80);
            out += static_cast<char>((pt & 0x3F) | 0x80);
        } else {
            out += static_cast<char>((pt >> 18) | 0xF0);
            out += static_cast<char>(((pt >> 12) & 0x3F) | 0x80);
            out += static_cast<char>(((pt >> 6) & 0x3F) | 0x80);
            out += static_cast<char>((pt & 0x3F) | 0x80);
        }
    }